

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void GEO::sort_unique<GEO::vector<unsigned_int>>(vector<unsigned_int> *v)

{
  vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_> *this;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  local_50;
  const_iterator local_48;
  uint *local_40;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  local_38;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  local_30;
  const_iterator local_28;
  uint *local_20;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
  local_18;
  vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_> *local_10;
  vector<unsigned_int> *v_local;
  
  local_10 = &v->super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>;
  local_18._M_current =
       (uint *)std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::begin
                         (&v->
                           super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                         );
  local_20 = (uint *)std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::
                     end(local_10);
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>>
            (local_18,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
                       )local_20);
  this = local_10;
  local_38._M_current =
       (uint *)std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::begin
                         (local_10);
  local_40 = (uint *)std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::
                     end(local_10);
  local_30 = std::
             unique<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>>
                       (local_38,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>_>
                                  )local_40);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>
  ::__normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>
              *)&local_28,&local_30);
  local_50._M_current =
       (uint *)std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::end
                         (local_10);
  __gnu_cxx::
  __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>
  ::__normal_iterator<unsigned_int*>
            ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,GEO::Memory::aligned_allocator<unsigned_int,64>>>
              *)&local_48,&local_50);
  std::vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>::erase
            (this,local_28,local_48);
  return;
}

Assistant:

inline void sort_unique(VECTOR& v) {
        std::sort(v.begin(), v.end());
        // Note that std::unique leaves a 'queue' of duplicated elements
        // at the end of the vector, and returns an iterator that
        // indicates where to stop. 
        v.erase(
            std::unique(v.begin(), v.end()), v.end()
        );
    }